

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__build_huffman(stbi__huffman *h,int *count)

{
  ushort uVar1;
  long lVar2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  stbi_uc *psVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  stbi__uint16 *psVar10;
  uint uVar11;
  char *pcVar12;
  long *in_FS_OFFSET;
  
  pcVar12 = "bad size list";
  iVar5 = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    lVar7 = (long)iVar5;
    for (iVar9 = 0; iVar9 < count[lVar2]; iVar9 = iVar9 + 1) {
      h->size[lVar7] = (char)lVar2 + '\x01';
      if (0xff < lVar7) goto LAB_001460af;
      lVar7 = lVar7 + 1;
    }
    iVar5 = iVar5 + iVar9;
  }
  h->size[iVar5] = '\0';
  uVar11 = 0;
  uVar3 = 1;
  pcVar12 = "bad code lengths";
  iVar5 = 0;
  do {
    if (uVar3 == 0x11) {
      h->maxcode[0x11] = 0xffffffff;
      memset(h,0xff,0x200);
      uVar8 = 0;
      uVar3 = (ulong)uVar11;
      if ((int)uVar11 < 1) {
        uVar3 = uVar8;
      }
      for (; uVar8 != uVar3; uVar8 = uVar8 + 1) {
        if (h->size[uVar8] < 10) {
          uVar1 = h->code[uVar8];
          bVar4 = 9 - h->size[uVar8];
          for (lVar2 = 0; (uint)lVar2 >> (bVar4 & 0x1f) == 0; lVar2 = lVar2 + 1) {
            h->fast[lVar2 + ((ulong)uVar1 << (bVar4 & 0x3f))] = (stbi_uc)uVar8;
          }
        }
      }
      return 1;
    }
    h->delta[uVar3] = uVar11 - iVar5;
    uVar8 = (ulong)h->size[(int)uVar11];
    if (uVar3 == uVar8) {
      psVar10 = h->code + (int)uVar11;
      psVar6 = h->size + (long)(int)uVar11 + 1;
      while (uVar3 == uVar8) {
        *psVar10 = (stbi__uint16)iVar5;
        iVar5 = iVar5 + 1;
        bVar4 = *psVar6;
        uVar11 = uVar11 + 1;
        psVar10 = psVar10 + 1;
        psVar6 = psVar6 + 1;
        uVar8 = (ulong)bVar4;
      }
      if (iVar5 - 1U >> ((byte)uVar3 & 0x1f) != 0) {
LAB_001460af:
        *(char **)(*in_FS_OFFSET + -0x20) = pcVar12;
        return 0;
      }
    }
    h->maxcode[uVar3] = iVar5 << (0x10 - (byte)uVar3 & 0x1f);
    iVar5 = iVar5 * 2;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static int stbi__build_huffman(stbi__huffman *h, int *count)
{
   int i,j,k=0;
   unsigned int code;
   // build size list for each symbol (from JPEG spec)
   for (i=0; i < 16; ++i) {
      for (j=0; j < count[i]; ++j) {
         h->size[k++] = (stbi_uc) (i+1);
         if(k >= 257) return stbi__err("bad size list","Corrupt JPEG");
      }
   }
   h->size[k] = 0;

   // compute actual symbols (from jpeg spec)
   code = 0;
   k = 0;
   for(j=1; j <= 16; ++j) {
      // compute delta to add to code to compute symbol id
      h->delta[j] = k - code;
      if (h->size[k] == j) {
         while (h->size[k] == j)
            h->code[k++] = (stbi__uint16) (code++);
         if (code-1 >= (1u << j)) return stbi__err("bad code lengths","Corrupt JPEG");
      }
      // compute largest code + 1 for this size, preshifted as needed later
      h->maxcode[j] = code << (16-j);
      code <<= 1;
   }
   h->maxcode[j] = 0xffffffff;

   // build non-spec acceleration table; 255 is flag for not-accelerated
   memset(h->fast, 255, 1 << FAST_BITS);
   for (i=0; i < k; ++i) {
      int s = h->size[i];
      if (s <= FAST_BITS) {
         int c = h->code[i] << (FAST_BITS-s);
         int m = 1 << (FAST_BITS-s);
         for (j=0; j < m; ++j) {
            h->fast[c+j] = (stbi_uc) i;
         }
      }
   }
   return 1;
}